

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subdivpatch1base.cpp
# Opt level: O1

void __thiscall
embree::SubdivPatch1Base::SubdivPatch1Base
          (SubdivPatch1Base *this,uint gID,uint pID,uint subPatch,SubdivMesh *mesh,size_t time,
          Vec2f *uv,float *edge_level,int *subdiv,int simd_width)

{
  HalfEdge *pHVar1;
  char *pcVar2;
  undefined4 *puVar3;
  undefined8 *puVar4;
  PatchType PVar5;
  Topology *pTVar6;
  HalfEdge *pHVar7;
  BufferView<embree::Vec3fa> *pBVar8;
  char *pcVar9;
  undefined1 *puVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined8 uVar15;
  int iVar16;
  size_t i;
  void *pvVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  HalfEdge *pHVar21;
  undefined1 *puVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  long *plVar26;
  long lVar27;
  long lVar28;
  uint uVar29;
  float fVar30;
  float fVar31;
  uint local_e18;
  uint local_e14;
  EVP_PKEY_CTX local_d80 [4];
  uint local_d7c [2];
  float local_d74 [13];
  undefined1 local_d40 [64];
  long local_d00 [8];
  float local_cc0 [2];
  uint local_cb8 [2];
  undefined8 local_cb0 [6];
  undefined1 local_c80 [512];
  long local_a80 [224];
  undefined1 local_380 [848];
  
  (this->root_ref).data.super_atomic<long>.super___atomic_base<long>._M_i = 0;
  (this->mtx).flag.super_atomic<bool>._M_base._M_i = false;
  this->flags = '\0';
  this->type = '\0';
  this->geom = gID;
  this->prim = pID;
  this->time_ = (uint)time;
  pTVar6 = (mesh->topology).items;
  pHVar7 = (pTVar6->halfEdges).items;
  uVar24 = (pTVar6->mesh->faceStartEdge).items[pID];
  pHVar1 = pHVar7 + uVar24;
  PVar5 = pHVar7[uVar24].patch_type;
  if (PVar5 == REGULAR_QUAD_PATCH) {
    this->type = '\x01';
    pBVar8 = (mesh->vertices).items;
    puVar22 = local_d40;
    lVar19 = 0;
    do {
      *(undefined1 **)((long)local_d00 + lVar19) = puVar22 + lVar19;
      *(undefined8 *)((long)local_cb8 + lVar19) = 0;
      *(undefined1 **)((long)local_a80 + lVar19) = local_c80 + lVar19;
      lVar19 = lVar19 + 0x340;
    } while (lVar19 != 0xd00);
    pcVar9 = pBVar8[time].super_RawBufferView.ptr_ofs;
    uVar18 = (ulong)(uint)pBVar8[time].super_RawBufferView.stride;
    lVar19 = 0;
    do {
      lVar20 = lVar19 * 0x340;
      pHVar7 = pHVar1 + lVar19;
      *(undefined4 *)(local_d80 + lVar20) = 0xffffffff;
      uVar15 = *(undefined8 *)(pcVar9 + pHVar1[lVar19].vtx_index * uVar18 + 8);
      local_cb0[lVar19 * 0x68] = *(undefined8 *)(pcVar9 + pHVar1[lVar19].vtx_index * uVar18);
      local_cb0[lVar19 * 0x68 + 1] = uVar15;
      local_d74[lVar19 * 0xd0] = pHVar1[lVar19].vertex_crease_weight;
      local_cc0[lVar19 * 0xd0 + 1] = pHVar1[lVar19].edge_level;
      local_cc0[lVar19 * 0xd0] = 0.0;
      puVar10 = local_c80 + lVar20;
      plVar26 = local_a80 + lVar19 * 0x68;
      local_e14 = 0xffffffff;
      local_e18 = 0xffffffff;
      uVar25 = 0;
      pHVar21 = pHVar7;
      do {
        fVar30 = pHVar21->edge_level;
        if (pHVar21->edge_level <= local_cc0[lVar19 * 0xd0]) {
          fVar30 = local_cc0[lVar19 * 0xd0];
        }
        local_cc0[lVar19 * 0xd0] = fVar30;
        fVar30 = pHVar21->edge_crease_weight;
        uVar24 = (uint)uVar25;
        if ((0x1f < uVar24) && ((undefined1 *)local_d00[lVar19 * 0x68] == local_d40 + lVar20)) {
          pvVar17 = operator_new__(0x100);
          local_d00[lVar19 * 0x68] = (long)pvVar17;
          lVar27 = 0;
          do {
            *(undefined4 *)(local_d00[lVar19 * 0x68] + lVar27 * 4) =
                 *(undefined4 *)(puVar22 + lVar27 * 4);
            lVar27 = lVar27 + 1;
          } while (lVar27 != 0x10);
        }
        *(float *)(local_d00[lVar19 * 0x68] + (uVar25 >> 1) * 4) = fVar30;
        lVar27 = (long)pHVar21->next_half_edge_ofs;
        uVar23 = pHVar21[lVar27].vtx_index;
        pcVar2 = pcVar9 + uVar18 * uVar23;
        uVar11 = *(undefined4 *)pcVar2;
        uVar12 = *(undefined4 *)(pcVar2 + 4);
        uVar13 = *(undefined4 *)(pcVar2 + 8);
        uVar14 = *(undefined4 *)(pcVar2 + 0xc);
        uVar29 = uVar24 + 1;
        if ((0x20 < uVar29) && ((undefined1 *)*plVar26 == puVar10)) {
          alignedMalloc(0x800,0x10);
          embree::SubdivPatch1Base();
        }
        if (uVar23 < local_e18) {
          local_e14 = uVar29 >> 1;
        }
        if (uVar23 < local_e18) {
          local_e18 = uVar23;
        }
        puVar3 = (undefined4 *)(*plVar26 + uVar25 * 0x10);
        *puVar3 = uVar11;
        puVar3[1] = uVar12;
        puVar3[2] = uVar13;
        puVar3[3] = uVar14;
        lVar28 = (long)pHVar21[lVar27].next_half_edge_ofs;
        pcVar2 = pcVar9 + pHVar21[lVar27 + lVar28].vtx_index * uVar18;
        uVar11 = *(undefined4 *)pcVar2;
        uVar12 = *(undefined4 *)(pcVar2 + 4);
        uVar13 = *(undefined4 *)(pcVar2 + 8);
        uVar14 = *(undefined4 *)(pcVar2 + 0xc);
        uVar23 = uVar24 + 2;
        if ((0x20 < uVar23) && ((undefined1 *)*plVar26 == puVar10)) {
          alignedMalloc(0x800,0x10);
          embree::SubdivPatch1Base();
        }
        puVar3 = (undefined4 *)(*plVar26 + (ulong)uVar29 * 0x10);
        *puVar3 = uVar11;
        puVar3[1] = uVar12;
        puVar3[2] = uVar13;
        puVar3[3] = uVar14;
        if ((long)pHVar21[lVar27 + lVar28 + pHVar21[lVar27 + lVar28].next_half_edge_ofs].
                  opposite_half_edge_ofs == 0) {
          uVar29 = pHVar21[lVar27 + lVar28 + pHVar21[lVar27 + lVar28].next_half_edge_ofs].vtx_index;
          if (uVar29 < local_e18) {
            local_e18 = uVar29;
            local_e14 = uVar23 >> 1;
          }
          *(uint *)(local_d80 + lVar20) = uVar23;
          if ((0x1f < uVar23) && ((undefined1 *)local_d00[lVar19 * 0x68] == local_d40 + lVar20)) {
            pvVar17 = operator_new__(0x100);
            local_d00[lVar19 * 0x68] = (long)pvVar17;
            lVar27 = 0;
            do {
              *(undefined4 *)(local_d00[lVar19 * 0x68] + lVar27 * 4) =
                   *(undefined4 *)(puVar22 + lVar27 * 4);
              lVar27 = lVar27 + 1;
            } while (lVar27 != 0x10);
          }
          *(undefined4 *)(local_d00[lVar19 * 0x68] + (ulong)(uVar23 >> 1) * 4) = 0x7f800000;
          pcVar2 = pcVar9 + uVar29 * uVar18;
          uVar11 = *(undefined4 *)pcVar2;
          uVar12 = *(undefined4 *)(pcVar2 + 4);
          uVar13 = *(undefined4 *)(pcVar2 + 8);
          uVar14 = *(undefined4 *)(pcVar2 + 0xc);
          if ((0x20 < uVar24 + 3) && ((undefined1 *)*plVar26 == puVar10)) {
            alignedMalloc(0x800,0x10);
            embree::SubdivPatch1Base();
          }
          puVar3 = (undefined4 *)(*plVar26 + (ulong)uVar23 * 0x10);
          *puVar3 = uVar11;
          puVar3[1] = uVar12;
          puVar3[2] = uVar13;
          puVar3[3] = uVar14;
          uVar23 = uVar24 + 4;
          if ((0x20 < uVar23) && ((undefined1 *)*plVar26 == puVar10)) {
            alignedMalloc(0x800,0x10);
            embree::SubdivPatch1Base();
          }
          uVar15 = local_cb0[lVar19 * 0x68 + 1];
          puVar4 = (undefined8 *)(local_a80[lVar19 * 0x68] + (ulong)(uVar24 + 3) * 0x10);
          *puVar4 = local_cb0[lVar19 * 0x68];
          puVar4[1] = uVar15;
          iVar16 = pHVar7->opposite_half_edge_ofs;
          pHVar21 = pHVar7;
          while (iVar16 != 0) {
            lVar27 = (long)iVar16;
            lVar28 = (long)iVar16;
            iVar16 = pHVar21[(long)iVar16 + (long)pHVar21[lVar27].next_half_edge_ofs].
                     opposite_half_edge_ofs;
            pHVar21 = pHVar21 + lVar28 + pHVar21[lVar27].next_half_edge_ofs;
          }
        }
        else {
          pHVar21 = pHVar21 + lVar27 + lVar28 + pHVar21[lVar27 + lVar28].next_half_edge_ofs +
                    pHVar21[lVar27 + lVar28 + pHVar21[lVar27 + lVar28].next_half_edge_ofs].
                    opposite_half_edge_ofs;
        }
        uVar25 = (ulong)uVar23;
      } while (pHVar21 != pHVar7);
      local_d7c[lVar19 * 0xd0 + 1] = uVar23;
      local_d7c[lVar19 * 0xd0] = uVar23 >> 1;
      local_cb8[lVar19 * 0xd0 + 1] = local_e18;
      local_cb8[lVar19 * 0xd0] = local_e14;
      lVar19 = lVar19 + 1;
      puVar22 = puVar22 + 0x340;
    } while (lVar19 != 4);
    BSplinePatchT<embree::Vec3fa,_embree::Vec3fa>::init
              ((BSplinePatchT<embree::Vec3fa,_embree::Vec3fa> *)this->patch_v,local_d80);
    lVar19 = -0xd00;
    puVar22 = local_380;
    do {
      puVar10 = *(undefined1 **)(puVar22 + 0x2c0);
      if (puVar10 != (undefined1 *)0x0 && puVar22 + 0xc0 != puVar10) {
        alignedFree(puVar10);
      }
      puVar10 = *(undefined1 **)(puVar22 + 0x40);
      if (puVar10 != (undefined1 *)0x0 && puVar22 != puVar10) {
        operator_delete__(puVar10);
      }
      puVar22 = puVar22 + -0x340;
      lVar19 = lVar19 + 0x340;
    } while (lVar19 != 0);
  }
  else if (PVar5 == BILINEAR_PATCH) {
    this->type = '\x06';
    pBVar8 = (mesh->vertices).items;
    pcVar9 = pBVar8[time].super_RawBufferView.ptr_ofs;
    uVar18 = (ulong)(uint)pBVar8[time].super_RawBufferView.stride;
    uVar15 = *(undefined8 *)(pcVar9 + pHVar1->vtx_index * uVar18 + 8);
    *(undefined8 *)&this->patch_v[0][0].field_0 =
         *(undefined8 *)(pcVar9 + pHVar1->vtx_index * uVar18);
    *(undefined8 *)((long)&this->patch_v[0][0].field_0 + 8) = uVar15;
    lVar19 = (long)pHVar1->next_half_edge_ofs;
    uVar15 = *(undefined8 *)(pcVar9 + pHVar1[lVar19].vtx_index * uVar18 + 8);
    *(undefined8 *)&this->patch_v[0][1].field_0 =
         *(undefined8 *)(pcVar9 + pHVar1[lVar19].vtx_index * uVar18);
    *(undefined8 *)((long)&this->patch_v[0][1].field_0 + 8) = uVar15;
    lVar20 = (long)pHVar1[lVar19].next_half_edge_ofs;
    uVar15 = *(undefined8 *)(pcVar9 + pHVar1[lVar19 + lVar20].vtx_index * uVar18 + 8);
    *(undefined8 *)&this->patch_v[0][2].field_0 =
         *(undefined8 *)(pcVar9 + pHVar1[lVar19 + lVar20].vtx_index * uVar18);
    *(undefined8 *)((long)&this->patch_v[0][2].field_0 + 8) = uVar15;
    uVar15 = *(undefined8 *)
              (pcVar9 + pHVar1[lVar19 + lVar20 + pHVar1[lVar19 + lVar20].next_half_edge_ofs].
                        vtx_index * uVar18 + 8);
    *(undefined8 *)&this->patch_v[0][3].field_0 =
         *(undefined8 *)
          (pcVar9 + pHVar1[lVar19 + lVar20 + pHVar1[lVar19 + lVar20].next_half_edge_ofs].vtx_index *
                    uVar18);
    *(undefined8 *)((long)&this->patch_v[0][3].field_0 + 8) = uVar15;
  }
  else {
    this->type = '\x05';
    pTVar6 = (mesh->topology).items;
    *(HalfEdge **)&this->patch_v[0][0].field_0 =
         (pTVar6->halfEdges).items + (pTVar6->mesh->faceStartEdge).items[pID];
    this->patch_v[0][0].field_0.m128[2] = (float)subPatch;
  }
  lVar19 = 0;
  do {
    fVar30 = uv[lVar19].field_0.field_0.x * 8192.0;
    if (65535.0 <= fVar30) {
      fVar30 = 65535.0;
    }
    fVar31 = 0.0;
    if (0.0 <= fVar30) {
      fVar31 = fVar30;
    }
    this->u[lVar19] = (unsigned_short)(int)fVar31;
    fVar30 = uv[lVar19].field_0.field_0.y * 8192.0;
    if (65535.0 <= fVar30) {
      fVar30 = 65535.0;
    }
    fVar31 = 0.0;
    if (0.0 <= fVar30) {
      fVar31 = fVar30;
    }
    this->v[lVar19] = (unsigned_short)(int)fVar31;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 4);
  updateEdgeLevels(this,edge_level,subdiv,(SubdivMesh *)0x4,simd_width);
  return;
}

Assistant:

SubdivPatch1Base::SubdivPatch1Base (const unsigned int gID,
                                      const unsigned int pID,
                                      const unsigned int subPatch,
                                      const SubdivMesh *const mesh,
                                      const size_t time,
                                      const Vec2f uv[4],
                                      const float edge_level[4],
                                      const int subdiv[4],
                                      const int simd_width)
  : flags(0), type(INVALID_PATCH), geom(gID), prim(pID), time_(unsigned(time))
  {
    static_assert(sizeof(SubdivPatch1Base) == 5 * 64, "SubdivPatch1Base has wrong size");

    const HalfEdge* edge = mesh->getHalfEdge(0,pID);

    if (edge->patch_type == HalfEdge::BILINEAR_PATCH)
    {
      type = BILINEAR_PATCH;
      new (patch_v) BilinearPatch3fa(edge,mesh->getVertexBuffer(time));
    }
    else if (edge->patch_type == HalfEdge::REGULAR_QUAD_PATCH) 
    {
#if PATCH_USE_BEZIER_PATCH 
      type = BEZIER_PATCH;
      new (patch_v) BezierPatch3fa(BSplinePatch3fa(CatmullClarkPatch3fa(edge,mesh->getVertexBuffer(time))));
#else
      type = BSPLINE_PATCH;
      new (patch_v) BSplinePatch3fa(CatmullClarkPatch3fa(edge,mesh->getVertexBuffer(time))); // FIXME: init BSpline directly from half edge structure
#endif      
    }
#if PATCH_USE_GREGORY == 2
    else if (edge->patch_type == HalfEdge::IRREGULAR_QUAD_PATCH) 
    {
      type = GREGORY_PATCH;
      new (patch_v) DenseGregoryPatch3fa(GregoryPatch3fa(CatmullClarkPatch3fa(edge,mesh->getVertexBuffer(time))));
    }
#endif
    else
    {
      type = EVAL_PATCH;
      set_edge(mesh->getHalfEdge(0,pID));
      set_subPatch(subPatch);
    }